

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O3

shared_ptr<duckdb::CSVBuffer,_true> __thiscall
duckdb::CSVBuffer::Next
          (CSVBuffer *this,CSVFileHandle *file_handle,idx_t buffer_size,bool *has_seaked)

{
  CSVBuffer *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  char *in_R8;
  shared_ptr<duckdb::CSVBuffer,_true> sVar3;
  undefined1 local_59;
  shared_ptr<duckdb::CSVBuffer,_true> local_58;
  idx_t buffer_size_local;
  CSVBuffer *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 *local_30;
  unsigned_long local_28;
  
  buffer_size_local = (idx_t)has_seaked;
  if (*in_R8 == '\x01') {
    CSVFileHandle::Seek((CSVFileHandle *)buffer_size,
                        (long)&((file_handle->main_mutex).super___mutex_base._M_mutex.__data.__list.
                               __next)->__prev +
                        *(long *)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex +
                                 0x10));
    *in_R8 = '\0';
  }
  local_28 = (long)&((file_handle->main_mutex).super___mutex_base._M_mutex.__data.__list.__next)->
                    __prev +
             *(long *)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex + 0x10);
  local_30 = (undefined1 *)
             ((long)&((file_handle->file_handle).
                      super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>
                      .super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl)->
                     _vptr_FileHandle + 1);
  local_40 = (CSVBuffer *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVBuffer,std::allocator<duckdb::CSVBuffer>,duckdb::CSVFileHandle&,duckdb::ClientContext&,unsigned_long&,unsigned_long,unsigned_long>
            (&local_38,&local_40,(allocator<duckdb::CSVBuffer> *)&local_59,
             (CSVFileHandle *)buffer_size,
             *(ClientContext **)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex + 8),
             &buffer_size_local,&local_28,(unsigned_long *)&local_30);
  local_58.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40;
  local_58.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_38._M_pi;
  if ((ClientContext *)local_38._M_pi != (ClientContext *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_38._M_pi)->_M_use_count)->_M_pi
           = *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_38._M_pi)->_M_use_count)
                      ->_M_pi + 1;
      UNLOCK();
      if ((ClientContext *)local_38._M_pi == (ClientContext *)0x0) goto LAB_01657465;
    }
    else {
      *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_38._M_pi)->_M_use_count)->_M_pi
           = *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_38._M_pi)->_M_use_count)
                      ->_M_pi + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
LAB_01657465:
  pCVar1 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(&local_58);
  _Var2._M_pi = extraout_RDX;
  if (pCVar1->actual_buffer_size == 0) {
    *(undefined8 *)this = 0;
    this->context = (ClientContext *)0x0;
    if ((ClientContext *)
        local_58.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (ClientContext *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  else {
    *(element_type **)this =
         local_58.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this->context =
         (ClientContext *)
         local_58.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::CSVBuffer,_true>)
         sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CSVBuffer> CSVBuffer::Next(CSVFileHandle &file_handle, idx_t buffer_size, bool &has_seaked) const {
	if (has_seaked) {
		// This means that at some point a reload was done, and we are currently on the incorrect position in our file
		// handle
		file_handle.Seek(global_csv_start + actual_buffer_size);
		has_seaked = false;
	}
	auto next_csv_buffer = make_shared_ptr<CSVBuffer>(file_handle, context, buffer_size,
	                                                  global_csv_start + actual_buffer_size, buffer_idx + 1);
	if (next_csv_buffer->GetBufferSize() == 0) {
		// We are done reading
		return nullptr;
	}
	return next_csv_buffer;
}